

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_bufput_bufstr(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  IRIns *pIVar6;
  byte bVar7;
  TRef TVar8;
  ulong uVar9;
  
  if ((J->flags & 0x80000) != 0) {
    uVar1 = (J->fold).right[0].field_0.op2;
    if (((((J->fold).left[0].field_1.o == 'U') && ((J->fold).left[0].field_0.op2 == 0)) &&
        ((J->fold).left[0].field_0.prev == uVar1)) &&
       (pIVar6 = (J->cur).ir, (J->fold).left[0].field_0.op1 == pIVar6[uVar1].field_0.op1)) {
      uVar1 = (J->fold).ins.field_0.op1;
      uVar9 = (ulong)((uint)uVar1 * 8);
      *(undefined2 *)((long)pIVar6 + uVar9 + 2) = 1;
      *(IRRef1 *)((long)(J->cur).ir + uVar9) = (J->fold).right[0].field_0.op1;
      return (TRef)uVar1;
    }
    pIVar6 = (J->cur).ir;
    if (((*(short *)((long)pIVar6 + (ulong)uVar1 * 8 + 2) == 0) &&
        (uVar9 = (ulong)(J->fold).right[0].field_0.op1,
        *(char *)((long)pIVar6 + uVar9 * 8 + 5) == 'a')) &&
       (uVar2 = *(ushort *)((long)pIVar6 + uVar9 * 8 + 2), (ushort)(uVar2 - 0x13) < 4)) {
      uVar9 = (ulong)pIVar6[uVar9].field_0.op1;
      uVar3 = pIVar6[uVar9].field_0.op1;
      if (uVar2 == IRCALL_lj_buf_putstr_rep) {
        if (pIVar6[uVar3].field_0.op1 == uVar1) {
          TVar8 = lj_ir_call(J,IRCALL_lj_buf_putstr_rep,(ulong)(J->fold).ins.field_0.op1,
                             (ulong)*(ushort *)((long)pIVar6 + (ulong)uVar3 * 8 + 2),
                             (ulong)*(ushort *)((long)pIVar6 + uVar9 * 8 + 2));
          return TVar8;
        }
      }
      else if (uVar3 == uVar1) {
        TVar8 = lj_ir_call(J,(uint)uVar2,(ulong)(J->fold).ins.field_0.op1,
                           (ulong)*(ushort *)((long)pIVar6 + uVar9 * 8 + 2));
        return TVar8;
      }
    }
  }
  uVar4 = (J->cur).nins;
  uVar9 = (ulong)uVar4;
  if (J->irtoplim <= uVar4) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar4 + 1;
  pIVar6 = (J->cur).ir;
  bVar7 = (J->fold).ins.field_1.o;
  *(IRRef1 *)((long)pIVar6 + uVar9 * 8 + 6) = J->chain[bVar7];
  J->chain[bVar7] = (IRRef1)uVar4;
  *(byte *)((long)pIVar6 + uVar9 * 8 + 5) = bVar7;
  pIVar6[uVar9].field_0.op1 = (J->fold).ins.field_0.op1;
  *(IRRef1 *)((long)pIVar6 + uVar9 * 8 + 2) = (J->fold).ins.field_0.op2;
  iVar5 = *(int *)((long)&(J->fold).ins + 4);
  bVar7 = (byte)iVar5;
  (J->guardemit).irt = (J->guardemit).irt | bVar7;
  *(byte *)((long)pIVar6 + uVar9 * 8 + 4) = bVar7;
  return iVar5 * 0x1000000 + uVar4;
}

Assistant:

LJFOLD(BUFPUT any BUFSTR)
LJFOLDF(bufput_bufstr)
{
  if ((J->flags & JIT_F_OPT_FWD)) {
    IRRef hdr = fright->op2;
    /* New buffer, no other buffer op inbetween and same buffer? */
    if (fleft->o == IR_BUFHDR && fleft->op2 == IRBUFHDR_RESET &&
	fleft->prev == hdr &&
	fleft->op1 == IR(hdr)->op1) {
      IRRef ref = fins->op1;
      IR(ref)->op2 = IRBUFHDR_APPEND;  /* Modify BUFHDR. */
      IR(ref)->op1 = fright->op1;
      return ref;
    }
    /* Replay puts to global temporary buffer. */
    if (IR(hdr)->op2 == IRBUFHDR_RESET) {
      IRIns *ir = IR(fright->op1);
      /* For now only handle single string.reverse .lower .upper .rep. */
      if (ir->o == IR_CALLL &&
	  ir->op2 >= IRCALL_lj_buf_putstr_reverse &&
	  ir->op2 <= IRCALL_lj_buf_putstr_rep) {
	IRIns *carg1 = IR(ir->op1);
	if (ir->op2 == IRCALL_lj_buf_putstr_rep) {
	  IRIns *carg2 = IR(carg1->op1);
	  if (carg2->op1 == hdr) {
	    return lj_ir_call(J, ir->op2, fins->op1, carg2->op2, carg1->op2);
	  }
	} else if (carg1->op1 == hdr) {
	  return lj_ir_call(J, ir->op2, fins->op1, carg1->op2);
	}
      }
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}